

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O1

int __thiscall SAT::findConflictLevel(SAT *this)

{
  int iVar1;
  uint uVar2;
  Clause *ps;
  ChannelInfo *pCVar3;
  long *plVar4;
  int extraout_EAX;
  uint uVar5;
  int iVar6;
  Clause *this_00;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t __size;
  bool bVar11;
  
  ps = this->confl;
  uVar5 = *(uint *)ps;
  iVar6 = -1;
  if (0xff < uVar5) {
    uVar10 = 0;
    do {
      iVar1 = (this->trailpos).data[(uint)(ps->data[uVar10].x >> 1)];
      if (iVar6 < iVar1) {
        iVar6 = iVar1;
      }
      uVar10 = uVar10 + 1;
    } while (uVar5 >> 8 != uVar10);
  }
  uVar9 = (ulong)engine.trail_lim.sz;
  uVar10 = (ulong)(engine.trail_lim.sz + 1);
  do {
    bVar11 = uVar9 == 0;
    uVar9 = uVar9 - 1;
    if (bVar11) {
      uVar10 = 0;
      break;
    }
    uVar10 = (ulong)((int)uVar10 - 1);
  } while (iVar6 < engine.trail_lim.data[uVar9]);
  iVar6 = (int)uVar10;
  if ((iVar6 != 0) || (!so.sym_static)) {
    if (((uVar5 & 2) != 0) && (iVar6 < (int)((this->trail).sz - 1))) {
      __size = 8;
      if (0xff < uVar5) {
        __size = (ulong)((uVar5 >> 8) - 1) * 4 + 8;
      }
      this_00 = (Clause *)malloc(__size);
      Clause::Clause<Clause>(this_00,ps,false);
      this->confl = this_00;
      *(byte *)this_00 = *(byte *)this_00 | 2;
      vec<Clause_*>::push((this->rtrail).data + uVar10,&this->confl);
    }
    btToLevel(this,iVar6);
    return iVar6;
  }
  findConflictLevel(this);
  iVar6 = extraout_EAX;
  if (engine.trail_lim.sz != 0) {
    uVar8 = (uint)uVar9;
    uVar5 = (int)uVar8 >> 1;
    iVar6 = (this->trailpos).data[uVar5];
    if (*engine.trail_lim.data <= iVar6) {
      printf("%d:",uVar9 & 0xffffffff);
      pCVar3 = (this->c_info).data;
      uVar2 = *(uint *)(pCVar3 + uVar5);
      uVar7 = uVar2 >> 0x1d & 3;
      if (uVar7 == 2) {
        plVar4 = *(long **)((long)engine.propagators.data + (ulong)(uVar2 << 3));
        iVar6 = (**(code **)(*plVar4 + 0x40))(plVar4,pCVar3[uVar5].val,uVar8 & 1);
        return iVar6;
      }
      if (uVar7 != 1) {
        iVar6 = printf(":%d:%d, ",(ulong)(uVar8 & 1),(ulong)(uint)(this->trailpos).data[uVar5]);
        return iVar6;
      }
      printf("[v%d ",(ulong)*(uint *)(*(long *)((long)engine.vars.data + (ulong)(uVar2 * 8)) + 8));
      iVar6 = (*(code *)(&DAT_001dfc10 +
                        *(int *)(&DAT_001dfc10 + (ulong)(uVar8 & 1 ^ (int)uVar2 >> 0x1f & 3U) * 4)))
                        ();
      return iVar6;
    }
  }
  return iVar6;
}

Assistant:

int SAT::findConflictLevel() {
	int tp = -1;
	for (unsigned int i = 0; i < confl->size(); i++) {
		const int l = trailpos[var((*confl)[i])];
		if (l > tp) {
			tp = l;
		}
	}
	const int clevel = engine.tpToLevel(tp);

	if (so.sym_static && clevel == 0) {
		btToLevel(0);
		engine.async_fail = true;
		NOT_SUPPORTED;
		// need to abort analyze as well
		return 0;
	}
	assert(clevel > 0);

	// duplicate conflict clause in case it gets freed
	if (clevel < decisionLevel() && confl->temp_expl) {
		confl = Clause_new(*confl);
		confl->temp_expl = 1;
		rtrail[clevel].push(confl);
	}
	btToLevel(clevel);

	//	fprintf(stderr, "clevel = %d\n", clevel);

	if (PRINT_ANALYSIS) {
		printf("Conflict: level = %d\n", clevel);
	}

	return clevel;
}